

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  pointer pcVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pointer pfVar11;
  pointer pfVar12;
  pointer pfVar13;
  bool bVar14;
  undefined4 extraout_EAX;
  uint uVar15;
  int *piVar16;
  long lVar17;
  ostream *poVar18;
  long *plVar19;
  pointer paVar20;
  undefined8 uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  char *this;
  int unaff_EBP;
  ulong uVar25;
  pointer paVar26;
  uint uVar27;
  ulong unaff_R12;
  uint uVar28;
  pointer paVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  float fVar33;
  float fVar34;
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float local_a20;
  int comp;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  int h;
  int w;
  undefined1 local_9c8 [16];
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string base_dir;
  string err;
  default_random_engine generator;
  string warn;
  string filename;
  attrib_t attrib;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  float n [3] [3];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  if (argc < 2) {
    printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
    return 1;
  }
  if (argc == 2) {
    fVar33 = 10000.0;
  }
  else {
    std::__cxx11::string::string((string *)n,argv[2],(allocator *)&warn);
    unaff_R12 = n[0]._0_8_;
    piVar16 = __errno_location();
    unaff_EBP = *piVar16;
    *piVar16 = 0;
    lVar17 = strtol((char *)unaff_R12,(char **)&attrib,10);
    if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)unaff_R12) {
      std::__throw_invalid_argument("stoi");
LAB_00113802:
      uVar21 = std::__throw_out_of_range("stoi");
      _Unwind_Resume(uVar21);
    }
    if (((int)lVar17 != lVar17) || (*piVar16 == 0x22)) goto LAB_00113802;
    if (*piVar16 == 0) {
      *piVar16 = unaff_EBP;
    }
    if ((float *)n[0]._0_8_ != n[1] + 1) {
      operator_delete((void *)n[0]._0_8_);
    }
    fVar33 = (float)(int)lVar17;
  }
  puts("# pc sampler");
  generator._M_x = 1;
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)n);
  lVar17 = std::__cxx11::string::find_last_of((char *)&filename,0x129d11,0xffffffffffffffff);
  if (lVar17 == -1) {
    base_dir._M_dataplus._M_p = (pointer)&base_dir.field_2;
    base_dir._M_string_length = 0;
    base_dir.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::find_last_of((char *)&filename,0x129d11,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&base_dir,(ulong)&filename);
    if (base_dir._M_string_length != 0) goto LAB_00112869;
  }
  std::__cxx11::string::_M_replace((ulong)&base_dir,0,(char *)0x0,0x129994);
LAB_00112869:
  std::__cxx11::string::append((char *)&base_dir);
  tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,filename._M_dataplus._M_p,
                   base_dir._M_dataplus._M_p,true,true);
  printf("# of vertices  = %d\n",
         (ulong)(uint)((int)((ulong)((long)attrib.vertices.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)attrib.vertices.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2) / 3));
  printf("# of normals   = %d\n",
         (ulong)(uint)((int)((ulong)((long)attrib.normals.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)attrib.normals.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2) / 3));
  printf("# of texcoords = %d\n",
         (ulong)(uint)((int)(((uint)((ulong)((long)attrib.texcoords.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)attrib.texcoords.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 0x21)
                             & 1) + (int)((ulong)((long)attrib.texcoords.
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)attrib.texcoords.
                                                                                                              
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2))
                      >> 1));
  this = (char *)&materials;
  printf("# of materials = %d\n",
         (ulong)(uint)((int)((ulong)((long)materials.
                                           super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)materials.
                                          super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      0x1fdcd759));
  printf("# of shapes    = %d\n");
  memset(n[1] + 1,0,0x718);
  n[0][2] = 0.0;
  n[1][0] = 0.0;
  local_58._M_left = &local_58;
  local_58._M_parent = (_Base_ptr)0x0;
  local_38 = 0;
  n[0]._0_8_ = n[1] + 1;
  local_58._M_right = local_58._M_left;
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
  emplace_back<tinyobj::material_t>
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)this,
             (anon_struct_1864_47_e17b0a7f *)n);
  tinyobj::anon_struct_1864_47_e17b0a7f::~material_t((anon_struct_1864_47_e17b0a7f *)n);
  if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    unaff_R12 = 0x90;
    this = "# material[%d].diffuse_texname = %s\n";
    uVar30 = 0;
    do {
      printf("# material[%d].diffuse_texname = %s\n",uVar30 & 0xffffffff,
             *(undefined8 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->ambient + (unaff_R12 - 0x20)));
      uVar30 = uVar30 + 1;
      unaff_R12 = unaff_R12 + 0x748;
    } while (uVar30 < (ulong)(((long)materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x63fb9aeb1fdcd759));
  }
  if (materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_a20 = 0.0;
  }
  else {
    lVar17 = 0x90;
    uVar30 = 0;
    paVar20 = materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    paVar29 = materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      lVar5 = *(long *)((long)paVar29->ambient + lVar17 + -0x18);
      if (lVar5 != 0) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)paVar29->ambient + lVar17 + -0x20);
        n[0]._0_8_ = n[1] + 1;
        pcVar6 = (__rhs->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)n,pcVar6,pcVar6 + lVar5);
        bVar14 = FileExists((string *)n[0]._0_8_);
        if (!bVar14) {
          std::operator+(&local_798,&base_dir,__rhs);
          std::__cxx11::string::operator=((string *)n,(string *)&local_798);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p);
          }
          bVar14 = FileExists((string *)n[0]._0_8_);
          if (!bVar14) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"# Unable to find file: ",0x17);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,
                                 *(char **)((long)paVar29->ambient + lVar17 + -0x20),
                                 *(long *)((long)paVar29->ambient + lVar17 + -0x18));
            std::endl<char,std::char_traits<char>>(poVar18);
            goto LAB_0011378f;
          }
        }
        this = (char *)stbi_load((char *)n[0]._0_8_,&w,&h,&comp,0);
        if ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)this ==
            (vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"# Unable to load texture: ",0x1a);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,(char *)n[0]._0_8_,n._8_8_);
          std::endl<char,std::char_traits<char>>(poVar18);
LAB_0011378f:
          exit(1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# Loaded texture: ",0x12);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)n[0]._0_8_,n._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", w = ",6);
        unaff_EBP = w;
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,w);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", h = ",6);
        unaff_R12 = (ulong)(uint)h;
        poVar18 = (ostream *)std::ostream::operator<<(poVar18,h);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,", comp = ",9);
        plVar19 = (long *)std::ostream::operator<<(poVar18,comp);
        std::ios::widen((char)*(undefined8 *)(*plVar19 + -0x18) + (char)plVar19);
        std::ostream::put((char)plVar19);
        std::ostream::flush();
        paVar20 = materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        paVar29 = materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((float *)n[0]._0_8_ != n[1] + 1) {
          operator_delete((void *)n[0]._0_8_);
          paVar20 = materials.
                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          paVar29 = materials.
                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar30 = uVar30 + 1;
      lVar17 = lVar17 + 0x748;
    } while (uVar30 < (ulong)(((long)paVar20 - (long)paVar29 >> 3) * 0x63fb9aeb1fdcd759));
    local_a20 = (float)(int)unaff_R12;
  }
  pfVar13 = attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar12 = attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  pfVar11 = attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
  paVar26 = ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl
              .super__Vector_impl_data._M_start)->mesh).indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (2 < (ulong)(((long)((shapes.
                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                           _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar26 >> 2) *
                 -0x5555555555555555)) {
    uVar25 = (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    uVar30 = 0;
    do {
      iVar31 = paVar26[uVar30 * 3].normal_index;
      iVar32 = paVar26[uVar30 * 3 + 1].normal_index;
      iVar4 = paVar26[uVar30 * 3 + 2].normal_index;
      fVar38 = 0.0;
      fVar41 = 0.0;
      fVar34 = 0.0;
      fVar37 = 0.0;
      fVar43 = 0.0;
      fVar47 = 0.0;
      if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar13) {
        uVar28 = paVar26[uVar30 * 3].texcoord_index;
        if (-1 < (int)uVar28) {
          uVar27 = paVar26[uVar30 * 3 + 1].texcoord_index;
          if (-1 < (int)uVar27) {
            uVar15 = paVar26[uVar30 * 3 + 2].texcoord_index;
            if (-1 < (int)uVar15) {
              local_9c8._0_4_ = iVar32;
              uVar22 = (ulong)uVar28 * 2 + 1;
              if (uVar25 <= uVar22) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx0.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x94,"int main(int, char **)");
              }
              uVar23 = (ulong)uVar27 * 2 + 1;
              if (uVar25 <= uVar23) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx1.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x96,"int main(int, char **)");
              }
              uVar24 = (ulong)uVar15 * 2 + 1;
              if (uVar25 <= uVar24) {
                __assert_fail("attrib.texcoords.size() > size_t(2 * idx2.texcoord_index + 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                              ,0x98,"int main(int, char **)");
              }
              fVar34 = 1.0 - pfVar13[uVar22];
              fVar43 = 1.0 - pfVar13[uVar23];
              fVar38 = 1.0 - pfVar13[uVar24];
              fVar41 = pfVar13[uVar15 * 2];
              fVar37 = pfVar13[uVar28 * 2];
              fVar47 = pfVar13[uVar27 * 2];
            }
          }
        }
      }
      if (paVar26[uVar30 * 3].vertex_index < 0) {
        __assert_fail("vi[0] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                      ,0xbc,"int main(int, char **)");
      }
      if (paVar26[uVar30 * 3 + 1].vertex_index < 0) {
        __assert_fail("vi[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                      ,0xbd,"int main(int, char **)");
      }
      if (paVar26[uVar30 * 3 + 2].vertex_index < 0) {
        __assert_fail("vi[2] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                      ,0xbe,"int main(int, char **)");
      }
      uVar23 = (ulong)(uint)(paVar26[uVar30 * 3 + 1].vertex_index * 3);
      uVar24 = (ulong)(uint)(paVar26[uVar30 * 3 + 2].vertex_index * 3);
      uVar22 = (ulong)(uint)(paVar26[uVar30 * 3].vertex_index * 3);
      fVar1 = pfVar11[uVar22];
      fVar39 = pfVar11[uVar22 + 1];
      fVar45 = pfVar11[uVar22 + 2];
      fVar40 = pfVar11[uVar23];
      local_9c8 = ZEXT416((uint)fVar40);
      fVar46 = pfVar11[uVar23 + 1];
      fVar2 = pfVar11[uVar23 + 2];
      fVar3 = pfVar11[uVar24];
      fVar42 = pfVar11[uVar24 + 1];
      fVar48 = pfVar11[uVar24 + 2];
      lVar17 = 0;
      do {
        fVar44 = (float)(int)lVar17;
        fVar49 = (float)iVar31 * 3.0 + fVar44;
        uVar22 = (ulong)fVar49;
        fVar50 = (float)iVar32 * 3.0 + fVar44;
        uVar23 = (ulong)fVar50;
        n[0][lVar17] = pfVar12[(long)(fVar49 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22];
        fVar44 = fVar44 + (float)iVar4 * 3.0;
        uVar22 = (ulong)fVar44;
        n[1][lVar17] = pfVar12[(long)(fVar50 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23];
        n[2][lVar17] = pfVar12[(long)(fVar44 - 9.223372e+18) & (long)uVar22 >> 0x3f | uVar22];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      fVar44 = fVar39 - fVar46;
      fVar49 = fVar45 - fVar2;
      fVar44 = SQRT(fVar49 * fVar49 + (fVar1 - fVar40) * (fVar1 - fVar40) + fVar44 * fVar44);
      fVar39 = fVar39 - fVar42;
      fVar42 = fVar42 - fVar46;
      fVar45 = fVar45 - fVar48;
      fVar48 = fVar48 - fVar2;
      auVar35._0_4_ = (fVar1 - fVar3) * (fVar1 - fVar3) + fVar39 * fVar39;
      auVar35._4_4_ = (fVar3 - fVar40) * (fVar3 - fVar40) + fVar42 * fVar42;
      auVar35._8_8_ = 0;
      auVar36._4_4_ = fVar48 * fVar48 + auVar35._4_4_;
      auVar36._0_4_ = fVar45 * fVar45 + auVar35._0_4_;
      auVar36._8_8_ = 0;
      auVar36 = sqrtps(auVar35,auVar36);
      fVar39 = (auVar36._4_4_ + fVar44 + auVar36._0_4_) * 0.5;
      fVar39 = (fVar39 - auVar36._4_4_) * (fVar39 - fVar44) * fVar39 * (fVar39 - auVar36._0_4_);
      if (fVar39 < 0.0) {
        fVar39 = sqrtf(fVar39);
      }
      else {
        fVar39 = SQRT(fVar39);
      }
      uVar28 = (uint)(fVar33 * fVar39);
      printf("# area %f nsamples %d \n",SUB84((double)fVar39,0),(ulong)uVar28);
      if (0 < (int)uVar28) {
        local_9c8._0_4_ = (float)local_9c8._0_4_ - fVar1;
        uVar27 = 0;
        do {
          do {
            dVar7 = std::
                    generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                              (&generator);
            dVar8 = std::
                    generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                              (&generator);
            fVar39 = (float)(dVar7 + 0.0);
            fVar45 = (float)(dVar8 + 0.0);
          } while (1.0 < fVar39 + fVar45);
          auVar9._4_4_ = fVar45 * (fVar41 - fVar37) + fVar39 * (fVar47 - fVar37) + fVar37;
          auVar9._0_4_ = fVar45 * (fVar38 - fVar34) + fVar39 * (fVar43 - fVar34) + fVar34;
          auVar9._8_4_ = fVar45 * 0.0 + fVar39 * 0.0 + 0.0;
          auVar9._12_4_ = fVar45 * 0.0 + fVar39 * 0.0 + 0.0;
          auVar36 = maxps(ZEXT816(0),auVar9);
          iVar31 = -(uint)(1.0 < auVar36._0_4_);
          iVar32 = -(uint)(1.0 < auVar36._4_4_);
          auVar10._4_4_ = iVar31;
          auVar10._0_4_ = iVar31;
          auVar10._8_4_ = iVar32;
          auVar10._12_4_ = iVar32;
          uVar15 = movmskpd(extraout_EAX,auVar10);
          fVar40 = 1.0;
          if ((uVar15 & 2) == 0) {
            fVar40 = auVar36._4_4_;
          }
          fVar46 = 1.0;
          if ((uVar15 & 1) == 0) {
            fVar46 = auVar36._0_4_;
          }
          lVar17 = (long)((int)(fVar46 * local_a20) * unaff_EBP + (int)(fVar40 * (float)unaff_EBP))
                   * (long)comp;
          printf("%f %f %f %f %f %f %d %d %d\n",
                 SUB84((double)(fVar45 * (fVar3 - fVar1) + fVar39 * (float)local_9c8._0_4_ + fVar1),
                       0),(ulong)*(byte *)((long)&(((
                                                  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  *)this)->
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                          lVar17),
                 (ulong)*(byte *)((long)&(((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                            *)this)->
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar17 + 1),
                 (ulong)*(byte *)((long)&(((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                            *)this)->
                                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar17 + 2));
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar28);
      }
      paVar26 = ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar30 = uVar30 + 1;
    } while (uVar30 < (ulong)(((long)((shapes.
                                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar26 >> 2
                              ) * -0x5555555555555555) / 3);
  }
  free(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)base_dir._M_dataplus._M_p != &base_dir.field_2) {
    operator_delete(base_dir._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  if (attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv){

    int point_per_sqm = 10000;

    if (argc < 2) {
      printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
      return 1;
    }
    if (argc >= 3) {
      point_per_sqm = std::stoi(argv[2]);
    }

    printf("# pc sampler\n");
    std::default_random_engine generator;
    std::uniform_real_distribution<double> distribution(0.0,1.0);

    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;

    std::string filename(argv[1]);
    std::string base_dir = GetBaseDir(filename);
    if (base_dir.empty()) {
        base_dir = ".";
    }

    base_dir += "/";


    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, filename.c_str(),
                              base_dir.c_str());

    printf("# of vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
    printf("# of normals   = %d\n", (int)(attrib.normals.size()) / 3);
    printf("# of texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
    printf("# of materials = %d\n", (int)materials.size());
    printf("# of shapes    = %d\n", (int)shapes.size());

    materials.push_back(tinyobj::material_t());
    unsigned char* image;
     int w, h;
      int comp;

    for (size_t i = 0; i < materials.size(); i++) {
        printf("# material[%d].diffuse_texname = %s\n", int(i),
        materials[i].diffuse_texname.c_str());
    }

    {
    for (size_t m = 0; m < materials.size(); m++) {
      tinyobj::material_t* mp = &materials[m];

      if (mp->diffuse_texname.length() > 0) {
        // Only load the texture if it is not already loaded
        {
         

          std::string texture_filename = mp->diffuse_texname;
          if (!FileExists(texture_filename)) {
            // Append base dir.
            texture_filename = base_dir + mp->diffuse_texname;
            if (!FileExists(texture_filename)) {
              std::cerr << "# Unable to find file: " << mp->diffuse_texname
                        << std::endl;
              exit(1);
            }
          }

          image = stbi_load(texture_filename.c_str(), &w, &h, &comp, STBI_default);
          if (!image) {
            std::cerr << "# Unable to load texture: " << texture_filename
                      << std::endl;
            exit(1);
          }
          std::cout << "# Loaded texture: " << texture_filename << ", w = " << w
                    << ", h = " << h << ", comp = " << comp << std::endl;
        }
      }
    }
  }

    int s = 0; //take first shape

    for (size_t f = 0; f < shapes[s].mesh.indices.size() / 3; f++) {

        tinyobj::index_t idx0 = shapes[s].mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = shapes[s].mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = shapes[s].mesh.indices[3 * f + 2];

        int current_material_id = shapes[s].mesh.material_ids[f];

        if ((current_material_id < 0) ||
            (current_material_id >= static_cast<int>(materials.size()))) {
          // Invaid material ID. Use default material.
          current_material_id =
              materials.size() -
              1;  // Default material is added to the last item in `materials`.
        }
        
       float tc[3][2];
        if (attrib.texcoords.size() > 0) {
          if ((idx0.texcoord_index < 0) || (idx1.texcoord_index < 0) ||
              (idx2.texcoord_index < 0)) {
            // face does not contain valid uv index.
            tc[0][0] = 0.0f;
            tc[0][1] = 0.0f;
            tc[1][0] = 0.0f;
            tc[1][1] = 0.0f;
            tc[2][0] = 0.0f;
            tc[2][1] = 0.0f;
          } else {
            assert(attrib.texcoords.size() >
                   size_t(2 * idx0.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx1.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx2.texcoord_index + 1));

            // Flip Y coord.
            tc[0][0] = attrib.texcoords[2 * idx0.texcoord_index];
            tc[0][1] = 1.0f - attrib.texcoords[2 * idx0.texcoord_index + 1];
            tc[1][0] = attrib.texcoords[2 * idx1.texcoord_index];
            tc[1][1] = 1.0f - attrib.texcoords[2 * idx1.texcoord_index + 1];
            tc[2][0] = attrib.texcoords[2 * idx2.texcoord_index];
            tc[2][1] = 1.0f - attrib.texcoords[2 * idx2.texcoord_index + 1];
          }
        } else {
          tc[0][0] = 0.0f;
          tc[0][1] = 0.0f;
          tc[1][0] = 0.0f;
          tc[1][1] = 0.0f;
          tc[2][0] = 0.0f;
          tc[2][1] = 0.0f;
        }

        //printf("%f %f %f %f %f %f\n", tc[0][0], tc[0][1], tc[1][0], tc[1][1], tc[2][0], tc[2][1]);
        
        int vi[3];      // indexes
        float v[3][3];  // coordinates
        float ni[3];
        float n[3][3];


         for (int k = 0; k < 3; k++) {
          vi[0] = idx0.vertex_index;
          vi[1] = idx1.vertex_index;
          vi[2] = idx2.vertex_index;
          
          ni[0] = idx0.normal_index;
          ni[1] = idx1.normal_index;
          ni[2] = idx2.normal_index;

          assert(vi[0] >= 0);
          assert(vi[1] >= 0);
          assert(vi[2] >= 0);

          v[0][k] = attrib.vertices[3 * vi[0] + k];
          v[1][k] = attrib.vertices[3 * vi[1] + k];
          v[2][k] = attrib.vertices[3 * vi[2] + k];
        
          n[0][k] = attrib.normals[3 * ni[0] + k];
          n[1][k] = attrib.normals[3 * ni[1] + k];
          n[2][k] = attrib.normals[3 * ni[2] + k];
        

        }

        float area;

        float l0 = sqrt((v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) + (v[0][1] - v[1][1]) * (v[0][1] - v[1][1]) + (v[0][2] - v[1][2]) * (v[0][2] - v[1][2]));
        float l1 = sqrt((v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) + (v[2][1] - v[1][1]) * (v[2][1] - v[1][1]) + (v[2][2] - v[1][2]) * (v[2][2] - v[1][2]));
        float l2 = sqrt((v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) + (v[0][1] - v[2][1]) * (v[0][1] - v[2][1]) + (v[0][2] - v[2][2]) * (v[0][2] - v[2][2]));
        
        float s = (l0 + l1 + l2)/2;

        area = sqrt(s * (s-l0) * (s-l1) * (s-l2));
        
        int nsamples = int(area * point_per_sqm);
        printf("# area %f nsamples %d \n", area, nsamples);
        

        for (int j = 0; j < nsamples; j++) {
            float lambda_a = 1;
            float lambda_b = 1;

            while (lambda_a + lambda_b > 1) {
              lambda_a = distribution(generator);
              lambda_b = distribution(generator);
            }

            float coordx = tc[0][0] + lambda_a * (tc[1][0] - tc[0][0]) + lambda_b*(tc[2][0] - tc[0][0]);
            float coordy = tc[0][1] + lambda_a * (tc[1][1] - tc[0][1]) + lambda_b*(tc[2][1] - tc[0][1]);

            if (coordx < 0) coordx = 0;
            if (coordx > 1) coordx = 1;
            if (coordy < 0) coordy = 0;
            if (coordy > 1) coordy = 1;

            int x = int(coordx * w);
            int y = int(coordy * h);

            unsigned char r = image[comp*(y * w + x)];
            unsigned char g = image[comp*(y * w + x) + 1];
            unsigned char b = image[comp*(y * w + x) + 2];

            float px = v[0][0] + lambda_a*(v[1][0] - v[0][0]) + lambda_b*(v[2][0] - v[0][0]);
            float py = v[0][1] + lambda_a*(v[1][1] - v[0][1]) + lambda_b*(v[2][1] - v[0][1]);
            float pz = v[0][2] + lambda_a*(v[1][2] - v[0][2]) + lambda_b*(v[2][2] - v[0][2]);

            float nx = n[0][0] + lambda_a*(n[1][0] - n[0][0]) + lambda_b*(n[2][0] - n[0][0]);
            float ny = n[0][1] + lambda_a*(n[1][1] - n[0][1]) + lambda_b*(n[2][1] - n[0][1]);
            float nz = n[0][2] + lambda_a*(n[1][2] - n[0][2]) + lambda_b*(n[2][2] - n[0][2]);

            printf("%f %f %f %f %f %f %d %d %d\n", px, py, pz, nx, ny, nz, int(r), int(g), int(b));
        }

    }


    stbi_image_free(image);

    return 0;
}